

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  vec<unsigned_int,_int> *pvVar5;
  long lVar6;
  long lVar7;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *this_01;
  CRef cr;
  int local_40;
  uint local_3c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  if (this->use_simplification == true) {
    local_40 = 0;
    if (0 < (this->super_Solver).next_var) {
      this_01 = &this->occurs;
      local_38 = this_01;
      do {
        OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
        ::clean(this_01,&local_40);
        if ((this->occurs).occs.map.sz <= local_40) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                        ,0x28,
                        "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        pvVar5 = (this_01->occs).map.data;
        if (0 < pvVar5[local_40].sz) {
          pvVar5 = pvVar5 + local_40;
          lVar6 = 0;
          lVar7 = 0;
          do {
            ClauseAllocator::reloc(&(this->super_Solver).ca,(CRef *)((long)pvVar5->data + lVar6),to)
            ;
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 4;
            this_01 = local_38;
          } while (lVar7 < pvVar5->sz);
        }
        local_40 = local_40 + 1;
      } while (local_40 < (this->super_Solver).next_var);
    }
    iVar4 = (this->subsumption_queue).first;
    iVar1 = (this->subsumption_queue).end;
    iVar3 = 0;
    if (iVar1 < iVar4) {
      iVar3 = (this->subsumption_queue).buf.sz;
    }
    iVar2 = (iVar1 - iVar4) + iVar3;
    if (iVar2 != 0 && SCARRY4(iVar1 - iVar4,iVar3) == iVar2 < 0) {
      this_00 = &(this->super_Solver).ca;
      iVar4 = ((iVar3 + iVar1) - iVar4) + 1;
      do {
        iVar1 = (this->subsumption_queue).first;
        if (iVar1 == (this->subsumption_queue).end) {
          __assert_fail("first != end",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Queue.h"
                        ,0x2f,"T Minisat::Queue<unsigned int>::peek() const [T = unsigned int]");
        }
        local_3c = (this->subsumption_queue).buf.data[iVar1];
        Queue<unsigned_int>::pop(&this->subsumption_queue);
        if ((this->super_Solver).ca.ra.sz <= local_3c) {
          __assert_fail("r < sz",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                        ,0x3f,
                        "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        if (((this_00->ra).memory[local_3c] & 3) == 0) {
          ClauseAllocator::reloc(this_00,&local_3c,to);
          Queue<unsigned_int>::insert(&this->subsumption_queue,local_3c);
        }
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,to);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        occurs.clean(i);
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = subsumption_queue.size(); i > 0; i--){
        CRef cr = subsumption_queue.peek(); subsumption_queue.pop();
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }
        
    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}